

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_library.hpp
# Opt level: O0

bool __thiscall
rtw::DynamicLibrary::load
          (DynamicLibrary *this,
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *search_paths)

{
  bool bVar1;
  reference path;
  void *pvVar2;
  string local_b0 [32];
  fs local_90 [8];
  string full_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *search_path;
  const_iterator __end2;
  const_iterator __begin2;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *search_paths_local;
  DynamicLibrary *this_local;
  
  if (this->library_ != (void *)0x0) {
    dylib::close((int)this->library_);
  }
  bVar1 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(search_paths);
  if (!bVar1) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((const_iterator *)&__end2._M_node,search_paths);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((const_iterator *)&search_path,search_paths);
    while (bVar1 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&search_path), bVar1) {
      path = std::
             _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                          *)&__end2._M_node);
      std::__cxx11::string::string(local_b0,(string *)this);
      fs::join<std::__cxx11::string>
                (local_90,path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      std::__cxx11::string::~string(local_b0);
      pvVar2 = dylib::load((string *)local_90);
      this->library_ = pvVar2;
      bVar1 = this->library_ != (void *)0x0;
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_90);
      if (bVar1) goto LAB_0018ea12;
      std::
      _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
      ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                    *)&__end2._M_node);
    }
  }
  pvVar2 = dylib::load(&this->name_);
  this->library_ = pvVar2;
  this_local._7_1_ = pvVar2 != (void *)0x0;
LAB_0018ea12:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool DynamicLibrary::load(const std::deque<std::string> & search_paths)
{
	if(library_)
	{
		dylib::close(library_);
	}

	if(!search_paths.empty())
	{
		for(const auto & search_path : search_paths)
		{
			const auto full_path = fs::join(search_path, name_);

			library_ = dylib::load(full_path);

			if(library_) return true;
		}
	}

	return (library_ = dylib::load(name_)) != nullptr;
}